

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

int find(char *name)

{
  int iVar1;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int hh2;
  int pos;
  char *name_local;
  
  if (*name == '\0') {
    local_2c = 0;
  }
  else {
    if (name[1] == '\0') {
      local_28 = (int)*name;
    }
    else {
      if (name[2] == '\0') {
        local_24 = *name * 0x1f + (int)name[1];
      }
      else {
        local_24 = *name * 0x47 + name[1] * 0x1f + (int)name[2];
      }
      local_28 = local_24;
    }
    local_2c = local_28;
  }
  if (*name == '\0') {
    local_34 = 1;
  }
  else {
    if (name[1] == '\0') {
      local_30 = *name * 3;
    }
    else {
      local_30 = *name * 0x33 + name[1] * 3;
    }
    local_34 = local_30;
  }
  local_20 = local_34 % 0xd3;
  if (local_20 == 0) {
    local_20 = 1;
  }
  while ((local_1c = local_2c % 0xd3, symbols[local_1c].notempty != '\0' &&
         (iVar1 = strcmp(symbols[local_1c].name,name), iVar1 != 0))) {
    local_2c = local_1c + local_20;
  }
  return local_1c;
}

Assistant:

static int find(const char *name) {
// returns hash entry if it exists, or first empty slot:
  int pos = name[0] ? (
    name[1] ? (
      name[2] ? 71*name[0]+31*name[1]+name[2] : 31*name[0]+name[1]
    ) :
      name[0]
  ) : 0;
  pos %= MAXSYMBOL;
  int hh2 = name[0] ? (
    (name[1]) ? 51*name[0]+3*name[1] : 3*name[0]
    ) : 1;
  hh2 %= MAXSYMBOL; if (!hh2) hh2 = 1;
  for (;;) {
    if (!symbols[pos].notempty) return pos;
    if (!strcmp(symbols[pos].name,name)) return pos;
    pos = (pos + hh2) % MAXSYMBOL;
  }
}